

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

Expression *
slang::ast::Expression::tryBindInterfaceRef
          (ASTContext *context,ExpressionSyntax *syntax,bool isInterfacePort)

{
  Compilation *compilation;
  InstanceBodySymbol *pIVar1;
  ResolvedConfig *pRVar2;
  ConfigRule *pCVar3;
  DeferredSourceRange sourceRange_00;
  __extent_storage<18446744073709551615UL> _Var4;
  undefined1 auVar5 [16];
  char *pcVar6;
  bool bVar7;
  SymbolKind SVar8;
  variant_alternative_t<0UL,_variant<const_ElementSelectSyntax_*,_MemberSelector>_> *args;
  Symbol *pSVar9;
  ArbitrarySymbolExpression *pAVar10;
  Diagnostic *pDVar11;
  SyntaxNode *pSVar12;
  Type *pTVar13;
  ModportSymbol *pMVar14;
  VirtualInterfaceType *elementType;
  long lVar15;
  LookupResult *args_00;
  LookupResult *in_R9;
  variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector> *sel
  ;
  pointer __v;
  SourceLocation SVar16;
  InstanceSymbol *this;
  InstanceBodySymbol **ppIVar17;
  span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> selectors;
  span<const_slang::ConstantRange,_18446744073709551615UL> dimensions;
  IfaceConn IVar18;
  string_view sVar19;
  SourceRange SVar20;
  SourceRange SVar21;
  string_view arg;
  string_view arg_00;
  size_t local_540;
  ModportSymbol *modport;
  char *local_530;
  SourceRange sourceRange;
  DeferredSourceRange local_518;
  HierarchicalReference *local_500;
  SourceLocation local_4f8;
  SourceLocation SStack_4f0;
  undefined8 local_4e8;
  HierarchicalReference hierRef;
  SmallVector<slang::ConstantRange,_4UL> dims;
  LookupResult result;
  
  for (pSVar12 = &syntax->super_SyntaxNode; pSVar12->kind == ParenthesizedExpression;
      pSVar12 = pSVar12[1].previewNode) {
  }
  bVar7 = slang::syntax::NameSyntax::isKind(pSVar12->kind);
  if (!bVar7) {
    if (isInterfacePort) {
      SVar20 = slang::syntax::SyntaxNode::sourceRange(pSVar12);
      ASTContext::addDiag(context,(DiagCode)0x5f0007,SVar20);
    }
    return (Expression *)0x0;
  }
  result.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .data_ = (pointer)result.selectors.
                    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                    .firstElement;
  result.found = (Symbol *)0x0;
  result.systemSubroutine._0_5_ = 0;
  result.systemSubroutine._5_3_ = 0;
  result.upwardCount = 0;
  result.flags.m_bits = '\0';
  result.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .len = 0;
  result.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .cap = 4;
  result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ =
       (pointer)result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.
                firstElement;
  result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.len = 0;
  result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.cap = 2;
  result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  args_00 = (LookupResult *)context;
  Lookup::name((NameSyntax *)pSVar12,context,
               (bitmask<slang::ast::LookupFlags>)((uint)isInterfacePort << 10),&result);
  local_518.range.startLoc = (SourceLocation)0x0;
  local_518.range.endLoc = (SourceLocation)0x0;
  local_518.node.value = 0;
  local_530 = (char *)0x0;
  local_540 = 0;
  if (result.found == (Symbol *)0x0) {
    if (((pSVar12->kind == ScopedName) && (*(short *)&pSVar12[1].parent == 0x19)) &&
       (**(int **)(pSVar12 + 2) == 0xe5)) {
      dims.super_SmallVectorBase<slang::ConstantRange>.firstElement =
           (char  [8])((long)dims.stackBase + 0x10);
      dims.super_SmallVectorBase<slang::ConstantRange>.data_ = (pointer)0x0;
      dims.super_SmallVectorBase<slang::ConstantRange>.len._0_5_ = 0;
      dims.super_SmallVectorBase<slang::ConstantRange>.len._5_3_ = 0;
      dims.super_SmallVectorBase<slang::ConstantRange>.cap._0_5_ = 0;
      dims.stackBase[0] = '\0';
      dims.stackBase[1] = '\0';
      dims.stackBase[2] = '\0';
      dims.stackBase[3] = '\0';
      dims.stackBase[4] = '\0';
      dims.stackBase[5] = '\0';
      dims.stackBase[6] = '\0';
      dims.stackBase[7] = '\0';
      dims.stackBase[8] = '\x04';
      dims.stackBase[9] = '\0';
      dims.stackBase[10] = '\0';
      dims.stackBase[0xb] = '\0';
      dims.stackBase[0xc] = '\0';
      dims.stackBase[0xd] = '\0';
      dims.stackBase[0xe] = '\0';
      dims.stackBase[0xf] = '\0';
      args_00 = (LookupResult *)context;
      Lookup::name(*(NameSyntax **)(pSVar12 + 1),context,(bitmask<slang::ast::LookupFlags>)0x0,
                   (LookupResult *)&dims);
      sVar19 = parsing::Token::valueText((Token *)(*(long *)(pSVar12 + 2) + 0x18));
      local_530 = sVar19._M_str;
      local_540 = sVar19._M_len;
      if (((dims.super_SmallVectorBase<slang::ConstantRange>.data_ != (pointer)0x0) &&
          (local_540 != 0)) &&
         (((dims.super_SmallVectorBase<slang::ConstantRange>.data_)->left == 0x31 ||
          ((dims.super_SmallVectorBase<slang::ConstantRange>.data_)->left == 0x2b)))) {
        args_00 = (LookupResult *)&dims;
        LookupResult::operator=(&result,args_00);
        local_518.node.value = *(uintptr_t *)(pSVar12 + 2);
        local_518.range.startLoc = (SourceLocation)0x0;
        local_518.range.endLoc = (SourceLocation)0x0;
      }
      LookupResult::~LookupResult((LookupResult *)&dims);
      if (result.found != (Symbol *)0x0) goto LAB_0035720e;
    }
    if (isInterfacePort) {
      LookupResult::reportDiags(&result,context);
    }
    pAVar10 = (ArbitrarySymbolExpression *)0x0;
    goto LAB_003578e3;
  }
LAB_0035720e:
  pSVar9 = result.found;
  compilation = ((context->scope).ptr)->compilation;
  modport = (ModportSymbol *)0x0;
  IVar18.second = (ModportSymbol *)0x0;
  IVar18.first = result.found;
  if ((result.found)->kind == InterfacePort) {
    result.flags.m_bits = result.flags.m_bits | 0x20;
    args_00 = (LookupResult *)result.found;
    SmallVectorBase<slang::ast::HierarchicalReference::Element>::
    emplace_back<slang::ast::Symbol_const&>
              (&result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>,
               result.found);
    IVar18 = InterfacePortSymbol::getConnection((InterfacePortSymbol *)pSVar9);
    modport = IVar18.second;
    if (IVar18.first == (Symbol *)0x0) {
LAB_00357519:
      LookupResult::reportDiags(&result,context);
      pAVar10 = (ArbitrarySymbolExpression *)badExpr(compilation,(Expression *)0x0);
      goto LAB_003578e3;
    }
    if (result.selectors.
        super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
        .len != 0) {
      dims.super_SmallVectorBase<slang::ConstantRange>.data_ =
           (pointer)dims.super_SmallVectorBase<slang::ConstantRange>.firstElement;
      dims.super_SmallVectorBase<slang::ConstantRange>.len._0_5_ = 0;
      dims.super_SmallVectorBase<slang::ConstantRange>.len._5_3_ = 0;
      dims.super_SmallVectorBase<slang::ConstantRange>.cap._0_5_ = 5;
      dims.super_SmallVectorBase<slang::ConstantRange>.cap._5_3_ = 0;
      __v = result.selectors.
            super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
            .data_;
      for (lVar15 = result.selectors.
                    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                    .len * 0x30; lVar15 != 0; lVar15 = lVar15 + -0x30) {
        args = std::
               get<0ul,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                         (__v);
        SmallVectorBase<slang::syntax::ElementSelectSyntax_const*>::
        emplace_back<slang::syntax::ElementSelectSyntax_const*const&>
                  ((SmallVectorBase<slang::syntax::ElementSelectSyntax_const*> *)&dims,args);
        __v = __v + 1;
      }
      selectors._M_ptr._5_3_ = dims.super_SmallVectorBase<slang::ConstantRange>.len._5_3_;
      selectors._M_ptr._0_5_ = (undefined5)dims.super_SmallVectorBase<slang::ConstantRange>.len;
      selectors._M_extent._M_extent_value = (size_t)context;
      args_00 = (LookupResult *)dims.super_SmallVectorBase<slang::ConstantRange>.data_;
      pSVar9 = Lookup::selectChild((Lookup *)IVar18.first,
                                   (Symbol *)dims.super_SmallVectorBase<slang::ConstantRange>.data_,
                                   selectors,(ASTContext *)&result,in_R9);
      result.selectors.
      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
      .len = 0;
      SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*>::cleanup
                ((SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*> *)&dims,
                 (EVP_PKEY_CTX *)args_00);
      IVar18.second = modport;
      IVar18.first = pSVar9;
      if (pSVar9 == (Symbol *)0x0) goto LAB_00357519;
    }
  }
  pSVar9 = IVar18.first;
  dims.super_SmallVectorBase<slang::ConstantRange>.data_ =
       (pointer)dims.super_SmallVectorBase<slang::ConstantRange>.firstElement;
  dims.super_SmallVectorBase<slang::ConstantRange>.len._0_5_ = 0;
  dims.super_SmallVectorBase<slang::ConstantRange>.len._5_3_ = 0;
  dims.super_SmallVectorBase<slang::ConstantRange>.cap._0_5_ = 4;
  dims.super_SmallVectorBase<slang::ConstantRange>.cap._5_3_ = 0;
  while( true ) {
    modport = IVar18.second;
    this = (InstanceSymbol *)IVar18.first;
    SVar8 = (this->super_InstanceSymbolBase).super_Symbol.kind;
    if (SVar8 != InstanceArray) break;
    if (*(long *)&this[1].super_InstanceSymbolBase.super_Symbol == 0) {
      args_00 = (LookupResult *)0x0;
      pAVar10 = (ArbitrarySymbolExpression *)badExpr(compilation,(Expression *)0x0);
      goto LAB_003578d6;
    }
    args_00 = (LookupResult *)&this[1].super_InstanceSymbolBase.super_Symbol.name;
    SmallVectorBase<slang::ConstantRange>::emplace_back<slang::ConstantRange_const&>
              (&dims.super_SmallVectorBase<slang::ConstantRange>,(ConstantRange *)args_00);
    IVar18.second = modport;
    IVar18.first = *(Symbol **)&this->canonicalBody->super_Symbol;
  }
  if (SVar8 == Modport) {
LAB_003574c8:
    LookupResult::reportDiags(&result,context);
    LookupResult::errorIfSelectors(&result,context);
    SVar20 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
    if ((this->super_InstanceSymbolBase).super_Symbol.kind == Modport) {
      ppIVar17 = (InstanceBodySymbol **)
                 &((this->super_InstanceSymbolBase).super_Symbol.parentScope)->thisSym;
      modport = (ModportSymbol *)this;
    }
    else {
      ppIVar17 = &this->body;
    }
    pIVar1 = *ppIVar17;
    sourceRange = SVar20;
    if (!isInterfacePort) {
      if (pIVar1->hierarchyOverrideNode != (HierarchyOverrideNode *)0x0) {
        pDVar11 = ASTContext::addDiag(context,(DiagCode)0xab0007,SVar20);
        pSVar12 = findOverrideNodeSource(pIVar1->hierarchyOverrideNode);
        if (pSVar12 != (SyntaxNode *)0x0) {
          SVar21 = slang::syntax::SyntaxNode::sourceRange(pSVar12);
          Diagnostic::addNote(pDVar11,(DiagCode)0x50001,SVar21);
        }
      }
      if ((pIVar1->parentInstance != (InstanceSymbol *)0x0) &&
         (pIVar1->parentInstance->resolvedConfig != (ResolvedConfig *)0x0)) {
        pDVar11 = ASTContext::addDiag(context,(DiagCode)0xaa0007,SVar20);
        pRVar2 = pIVar1->parentInstance->resolvedConfig;
        pCVar3 = pRVar2->configRule;
        if (pCVar3 == (ConfigRule *)0x0) {
          Diagnostic::addNote(pDVar11,(DiagCode)0x40001,(pRVar2->useConfig->super_Symbol).location);
        }
        else {
          SVar21 = slang::syntax::SyntaxNode::sourceRange((pCVar3->syntax).ptr);
          Diagnostic::addNote(pDVar11,(DiagCode)0x40001,SVar21);
        }
      }
    }
    pcVar6 = local_530;
    SVar16 = SVar20.startLoc;
    if (local_540 == 0) {
LAB_003577a4:
      local_500 = (HierarchicalReference *)CONCAT71(local_500._1_7_,1);
      hierRef.target = (Symbol *)SVar16;
      elementType = BumpAllocator::
                    emplace<slang::ast::VirtualInterfaceType,slang::ast::InstanceSymbol_const&,slang::ast::ModportSymbol_const*&,bool,slang::SourceLocation>
                              (&compilation->super_BumpAllocator,pIVar1->parentInstance,&modport,
                               (bool *)&local_500,(SourceLocation *)&hierRef);
      _Var4._M_extent_value._5_3_ = dims.super_SmallVectorBase<slang::ConstantRange>.len._5_3_;
      _Var4._M_extent_value._0_5_ = (undefined5)dims.super_SmallVectorBase<slang::ConstantRange>.len
      ;
      if (_Var4._M_extent_value != 0) {
        SStack_4f0 = sourceRange.endLoc;
        local_4e8 = 1;
        sourceRange_00.range.endLoc = sourceRange.endLoc;
        sourceRange_00.range.startLoc = SVar16;
        sourceRange_00.node.value = 1;
        dimensions._M_extent._M_extent_value = _Var4._M_extent_value;
        dimensions._M_ptr = dims.super_SmallVectorBase<slang::ConstantRange>.data_;
        local_4f8 = SVar16;
        elementType = (VirtualInterfaceType *)
                      FixedSizeUnpackedArrayType::fromDims
                                ((context->scope).ptr,&elementType->super_Type,dimensions,
                                 sourceRange_00);
      }
      if (pSVar9->kind == Modport) {
        pSVar9 = (Symbol *)pSVar9->parentScope->thisSym[1].originatingSyntax;
      }
      HierarchicalReference::fromLookup(&hierRef,compilation,&result);
      args_00 = (LookupResult *)(context->scope).ptr;
      local_500 = &hierRef;
      pAVar10 = BumpAllocator::
                emplace<slang::ast::ArbitrarySymbolExpression,slang::ast::Scope_const&,slang::ast::Symbol_const&,slang::ast::Type_const&,slang::ast::HierarchicalReference*,slang::SourceRange&>
                          (&compilation->super_BumpAllocator,(Scope *)args_00,pSVar9,
                           &elementType->super_Type,&local_500,&sourceRange);
    }
    else if (modport == (ModportSymbol *)0x0) {
      sVar19._M_str = local_530;
      sVar19._M_len = local_540;
      pMVar14 = (ModportSymbol *)Scope::find(&pIVar1->super_Scope,sVar19);
      if ((pMVar14 != (ModportSymbol *)0x0) && ((pMVar14->super_Symbol).kind == Modport)) {
        SVar16 = sourceRange.startLoc;
        modport = pMVar14;
        goto LAB_003577a4;
      }
      SVar20 = slang::syntax::DeferredSourceRange::get(&local_518);
      pDVar11 = ASTContext::addDiag(context,(DiagCode)0x22000a,SVar20);
      arg_00._M_str = pcVar6;
      arg_00._M_len = local_540;
      Diagnostic::operator<<(pDVar11,arg_00);
      Diagnostic::operator<<(pDVar11,(pIVar1->definition->super_Symbol).name);
      args_00 = (LookupResult *)0x0;
      pAVar10 = (ArbitrarySymbolExpression *)badExpr(compilation,(Expression *)0x0);
    }
    else {
      SVar20 = slang::syntax::DeferredSourceRange::get(&local_518);
      pcVar6 = local_530;
      pDVar11 = ASTContext::addDiag(context,(DiagCode)0x14000a,SVar20);
      arg._M_str = pcVar6;
      arg._M_len = local_540;
      Diagnostic::operator<<(pDVar11,arg);
      Diagnostic::operator<<(pDVar11,(pIVar1->definition->super_Symbol).name);
      Diagnostic::operator<<(pDVar11,(modport->super_Symbol).name);
      args_00 = (LookupResult *)0x0;
      pAVar10 = (ArbitrarySymbolExpression *)badExpr(compilation,(Expression *)0x0);
    }
  }
  else {
    if (SVar8 == Instance) {
      bVar7 = InstanceSymbol::isInterface(this);
      if (bVar7) goto LAB_003574c8;
      SVar8 = (this->super_InstanceSymbolBase).super_Symbol.kind;
    }
    if (SVar8 == UninstantiatedDef) {
LAB_00357639:
      args_00 = (LookupResult *)(context->scope).ptr;
      pTVar13 = compilation->errorType;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = sourceRange.endLoc;
      sourceRange = (SourceRange)(auVar5 << 0x40);
      hierRef._0_16_ = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
      pAVar10 = BumpAllocator::
                emplace<slang::ast::ArbitrarySymbolExpression,slang::ast::Scope_const&,slang::ast::Symbol_const&,slang::ast::Type_const&,decltype(nullptr),slang::SourceRange>
                          (&compilation->super_BumpAllocator,(Scope *)args_00,pSVar9,pTVar13,
                           (void **)&sourceRange,(SourceRange *)&hierRef);
    }
    else {
      if (SVar8 == Variable) {
        pTVar13 = DeclaredType::getType((DeclaredType *)&(this->super_InstanceSymbolBase).arrayPath)
        ;
        bVar7 = Type::isError(pTVar13);
        if (bVar7) goto LAB_00357639;
      }
      if ((isInterfacePort) && ((pSVar9->name)._M_len != 0)) {
        SVar20 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
        pDVar11 = ASTContext::addDiag(context,(DiagCode)0x26000a,SVar20);
        pDVar11 = Diagnostic::operator<<(pDVar11,pSVar9->name);
        args_00 = (LookupResult *)0x50001;
        Diagnostic::addNote(pDVar11,(DiagCode)0x50001,pSVar9->location);
      }
      pAVar10 = (ArbitrarySymbolExpression *)0x0;
    }
  }
LAB_003578d6:
  SmallVectorBase<slang::ConstantRange>::cleanup
            (&dims.super_SmallVectorBase<slang::ConstantRange>,(EVP_PKEY_CTX *)args_00);
LAB_003578e3:
  LookupResult::~LookupResult(&result);
  return &pAVar10->super_Expression;
}

Assistant:

Expression* Expression::tryBindInterfaceRef(const ASTContext& context,
                                            const ExpressionSyntax& syntax, bool isInterfacePort) {
    // Unwrap the expression; parentheses are superfluous.
    const ExpressionSyntax* expr = &syntax;
    while (expr->kind == SyntaxKind::ParenthesizedExpression)
        expr = expr->as<ParenthesizedExpressionSyntax>().expression;

    // Connection must be a name (not some arbitrary expression).
    if (!NameSyntax::isKind(expr->kind)) {
        if (isInterfacePort)
            context.addDiag(diag::InterfacePortInvalidExpression, expr->sourceRange());
        return nullptr;
    }

    // Try to look up that name.
    LookupResult result;
    auto flags = isInterfacePort ? LookupFlags::IfacePortConn : LookupFlags::None;
    Lookup::name(expr->as<NameSyntax>(), context, flags, result);

    DeferredSourceRange modportRange;
    std::string_view arrayModportName;
    if (!result.found) {
        // We didn't find the name as-is. This might be a case where the user has
        // provided an explicit modport name on top of an array of interfaces,
        // which we should support by looking up the name again without the trailing
        // name component and taking the result if it's an iface array.
        if (expr->kind == SyntaxKind::ScopedName) {
            auto& scoped = expr->as<ScopedNameSyntax>();
            if (scoped.separator.kind == TokenKind::Dot &&
                scoped.right->kind == SyntaxKind::IdentifierName) {
                LookupResult result2;
                Lookup::name(*scoped.left, context, LookupFlags::None, result2);
                arrayModportName = scoped.right->as<IdentifierNameSyntax>().identifier.valueText();

                auto found = result2.found;
                if (found && !arrayModportName.empty() &&
                    (found->kind == SymbolKind::InterfacePort ||
                     found->kind == SymbolKind::InstanceArray)) {
                    result = result2;
                    modportRange = *scoped.right;
                }
            }
        }

        // If still not found we can't make a connection. Error if this is for a
        // port, and otherwise return null to let the caller try binding as a
        // normal expression.
        if (!result.found) {
            if (isInterfacePort)
                result.reportDiags(context);
            return nullptr;
        }
    }

    auto& comp = context.getCompilation();
    auto symbol = result.found;
    const InterfacePortSymbol* ifacePort = nullptr;
    const ModportSymbol* modport = nullptr;

    // If we found an interface port we should unwrap to what it's connected to.
    if (symbol->kind == SymbolKind::InterfacePort) {
        result.flags |= LookupResultFlags::IfacePort;
        result.path.emplace_back(*symbol);

        ifacePort = &symbol->as<InterfacePortSymbol>();
        std::tie(symbol, modport) = ifacePort->getConnection();

        if (symbol && !result.selectors.empty()) {
            SmallVector<const ElementSelectSyntax*> selectors;
            for (auto& sel : result.selectors)
                selectors.push_back(std::get<0>(sel));

            symbol = Lookup::selectChild(*symbol, selectors, context, result);
            result.selectors.clear();
        }

        if (!symbol) {
            // Returning nullptr from this function means to try doing normal expression
            // creation, but if we hit this case here we found the iface and simply failed
            // to connect it, likely because we're in an uninstantiated context. Return
            // a badExpr here to silence any follow on errors that might otherwise result.
            result.reportDiags(context);
            return &badExpr(comp, nullptr);
        }
    }

    // Unwrap any interface arrays we found, collect the dimensions along the way.
    SmallVector<ConstantRange, 4> dims;
    auto origSymbol = symbol;
    while (symbol->kind == SymbolKind::InstanceArray) {
        auto& array = symbol->as<InstanceArraySymbol>();
        if (array.elements.empty())
            return &badExpr(comp, nullptr);

        dims.push_back(array.range);
        symbol = array.elements[0];
    }

    // If we didn't find a modport or an interface instance then this is not
    // an interface connection.
    if (symbol->kind != SymbolKind::Modport &&
        (symbol->kind != SymbolKind::Instance || !symbol->as<InstanceSymbol>().isInterface())) {
        // If this is a variable with an errored type, an error is already emitted.
        if (symbol->kind == SymbolKind::UninstantiatedDef ||
            (symbol->kind == SymbolKind::Variable &&
             symbol->as<VariableSymbol>().getType().isError())) {
            return comp.emplace<ArbitrarySymbolExpression>(*context.scope, *origSymbol,
                                                           comp.getErrorType(), nullptr,
                                                           syntax.sourceRange());
        }

        if (isInterfacePort && !origSymbol->name.empty()) {
            auto& diag = context.addDiag(diag::NotAnInterface, syntax.sourceRange())
                         << origSymbol->name;
            diag.addNote(diag::NoteDeclarationHere, origSymbol->location);
        }

        // Return nullptr to let the parent try normal expression binding.
        return nullptr;
    }

    // At this point we've found a connection so we're no longer speculatively
    // trying to connect, we're going to connect or issue an error.
    result.reportDiags(context);
    result.errorIfSelectors(context);

    auto sourceRange = syntax.sourceRange();
    const InstanceBodySymbol* iface = nullptr;
    if (symbol->kind == SymbolKind::Modport) {
        modport = &symbol->as<ModportSymbol>();
        iface = &symbol->getParentScope()->asSymbol().as<InstanceBodySymbol>();
    }
    else {
        iface = &symbol->as<InstanceSymbol>().body;
    }

    if (!isInterfacePort) {
        if (iface->hierarchyOverrideNode) {
            auto& diag = context.addDiag(diag::VirtualIfaceDefparam, sourceRange);
            if (auto source = findOverrideNodeSource(*iface->hierarchyOverrideNode))
                diag.addNote(diag::NoteDeclarationHere, source->sourceRange());
        }

        if (iface->parentInstance && iface->parentInstance->resolvedConfig) {
            auto& diag = context.addDiag(diag::VirtualIfaceConfigRule, sourceRange);

            auto rc = iface->parentInstance->resolvedConfig;
            if (rc->configRule)
                diag.addNote(diag::NoteConfigRule, rc->configRule->syntax->sourceRange());
            else
                diag.addNote(diag::NoteConfigRule, rc->useConfig.location);
        }
    }

    if (!arrayModportName.empty()) {
        if (modport) {
            // If we connected via an interface port that itself has a modport restriction,
            // we can't also be restricting via an interface array modport.
            auto& diag = context.addDiag(diag::InvalidModportAccess, *modportRange);
            diag << arrayModportName;
            diag << iface->getDefinition().name;
            diag << modport->name;
            return &badExpr(comp, nullptr);
        }
        else {
            auto sym = iface->find(arrayModportName);
            if (!sym || sym->kind != SymbolKind::Modport) {
                auto& diag = context.addDiag(diag::NotAModport, *modportRange);
                diag << arrayModportName;
                diag << iface->getDefinition().name;
                return &badExpr(comp, nullptr);
            }

            modport = &sym->as<ModportSymbol>();
        }
    }

    // Now make sure the interface or modport we found matches the target type.
    // Fabricate a virtual interface type for the rhs that we can use for matching.
    SLANG_ASSERT(iface->parentInstance);
    const Type* type = comp.emplace<VirtualInterfaceType>(*iface->parentInstance, modport,
                                                          /* isRealIface */ true,
                                                          sourceRange.start());
    if (!dims.empty())
        type = &FixedSizeUnpackedArrayType::fromDims(*context.scope, *type, dims, sourceRange);

    // Don't return a modport as the symbol target, it's expected that it
    // will be pulled from the virtual interface type instead.
    if (origSymbol->kind == SymbolKind::Modport) {
        origSymbol = &origSymbol->getParentScope()->asSymbol();
        origSymbol = origSymbol->as<InstanceBodySymbol>().parentInstance;
    }

    auto hierRef = HierarchicalReference::fromLookup(comp, result);
    return comp.emplace<ArbitrarySymbolExpression>(*context.scope, *origSymbol, *type, &hierRef,
                                                   sourceRange);
}